

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O0

bool tcu::hasStencilComponent(ChannelOrder order)

{
  bool local_9;
  ChannelOrder order_local;
  
  local_9 = order == S || order == DS;
  return local_9;
}

Assistant:

bool hasStencilComponent (TextureFormat::ChannelOrder order)
{
	DE_STATIC_ASSERT(TextureFormat::CHANNELORDER_LAST == 21);

	switch (order)
	{
		case TextureFormat::S:
		case TextureFormat::DS:
			return true;

		default:
			return false;
	}
}